

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::FocusTopMostWindowUnderOne(ImGuiWindow *under_this_window,ImGuiWindow *ignore_window)

{
  ImGuiWindow *window;
  bool bVar1;
  uint uVar2;
  ImGuiContext *pIVar3;
  int iVar4;
  uint uVar5;
  ImGuiWindow *window_00;
  int iVar6;
  
  pIVar3 = GImGui;
  if (under_this_window == (ImGuiWindow *)0x0) {
    uVar5 = (GImGui->WindowsFocusOrder).Size - 1;
  }
  else {
    iVar6 = -1;
    if ((under_this_window->Flags & 0x1000000) != 0) {
      do {
        under_this_window = under_this_window->ParentWindow;
      } while ((under_this_window->Flags & 0x1000000) != 0);
      iVar6 = 0;
    }
    iVar4 = FindWindowFocusIndex(under_this_window);
    uVar5 = iVar4 + iVar6;
  }
  if ((int)uVar5 < 0) {
    window_00 = (ImGuiWindow *)0x0;
  }
  else {
    window_00 = (ImGuiWindow *)0x0;
    uVar2 = uVar5;
    do {
      if ((pIVar3->WindowsFocusOrder).Size <= (int)uVar5) {
        __assert_fail("i >= 0 && i < Size",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/imgui-src/imgui.h"
                      ,0x74f,"T &ImVector<ImGuiWindow *>::operator[](int) [T = ImGuiWindow *]");
      }
      window = (pIVar3->WindowsFocusOrder).Data[uVar2];
      if (window != window->RootWindow) {
        __assert_fail("window == window->RootWindow",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/imgui-src/imgui.cpp"
                      ,0x1cc5,"void ImGui::FocusTopMostWindowUnderOne(ImGuiWindow *, ImGuiWindow *)"
                     );
      }
      if (((window != ignore_window) && (window->WasActive == true)) &&
         ((~window->Flags & 0x40200U) != 0)) {
        window_00 = NavRestoreLastChildNavWindow(window);
        break;
      }
      bVar1 = 0 < (int)uVar2;
      uVar2 = uVar2 - 1;
    } while (bVar1);
  }
  FocusWindow(window_00);
  return;
}

Assistant:

void ImGui::FocusTopMostWindowUnderOne(ImGuiWindow* under_this_window, ImGuiWindow* ignore_window)
{
    ImGuiContext& g = *GImGui;
    int start_idx = g.WindowsFocusOrder.Size - 1;
    if (under_this_window != NULL)
    {
        // Aim at root window behind us, if we are in a child window that's our own root (see #4640)
        int offset = -1;
        while (under_this_window->Flags & ImGuiWindowFlags_ChildWindow)
        {
            under_this_window = under_this_window->ParentWindow;
            offset = 0;
        }
        start_idx = FindWindowFocusIndex(under_this_window) + offset;
    }
    for (int i = start_idx; i >= 0; i--)
    {
        // We may later decide to test for different NoXXXInputs based on the active navigation input (mouse vs nav) but that may feel more confusing to the user.
        ImGuiWindow* window = g.WindowsFocusOrder[i];
        IM_ASSERT(window == window->RootWindow);
        if (window != ignore_window && window->WasActive)
            if ((window->Flags & (ImGuiWindowFlags_NoMouseInputs | ImGuiWindowFlags_NoNavInputs)) != (ImGuiWindowFlags_NoMouseInputs | ImGuiWindowFlags_NoNavInputs))
            {
                // FIXME-DOCK: This is failing (lagging by one frame) for docked windows.
                // If A and B are docked into window and B disappear, at the NewFrame() call site window->NavLastChildNavWindow will still point to B.
                // We might leverage the tab order implicitly stored in window->DockNodeAsHost->TabBar (essentially the 'most_recently_selected_tab' code in tab bar will do that but on next update)
                // to tell which is the "previous" window. Or we may leverage 'LastFrameFocused/LastFrameJustFocused' and have this function handle child window itself?
                ImGuiWindow* focus_window = NavRestoreLastChildNavWindow(window);
                FocusWindow(focus_window);
                return;
            }
    }
    FocusWindow(NULL);
}